

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int execve(char *__path,char **__argv,char **__envp)

{
  apprun_exec_args_t *args;
  ssize_t sVar1;
  
  args = apprun_adjusted_exec_args(__path,__argv,__envp);
  real_execve = (execve_func_t)dlsym(0xffffffffffffffff,"execve");
  sVar1 = (*real_execve)(args->file,args->args,args->envp);
  apprun_restore_workdir_if_needed();
  apprun_exec_args_free(args);
  return (int)sVar1;
}

Assistant:

int execve(const char *filename, char *const argv[], char *const envp[]) {
    apprun_exec_args_t *new_exec_args = apprun_adjusted_exec_args(filename, argv, envp);

    real_execve = dlsym(RTLD_NEXT, "execve");
    int ret = real_execve(new_exec_args->file, new_exec_args->args, new_exec_args->envp);

    apprun_restore_workdir_if_needed();
    apprun_exec_args_free(new_exec_args);
    return ret;
}